

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O2

int main(void)

{
  int line;
  int iVar1;
  int line_00;
  int line_01;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  int in_ECX;
  int *address;
  ulong uVar5;
  int in_EDX;
  int family;
  int sock;
  int family_00;
  int sock_00;
  int family_01;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int sock_05;
  FILE *pFVar6;
  undefined8 uStackY_50;
  char buf [7];
  int deadline;
  
  line = test_socket_impl((char *)0x2a,0x62,in_EDX,in_ECX);
  address = &deadline;
  deadline = 500;
  iVar1 = nn_setsockopt(line,0x62,1,address,4);
  pFVar6 = _stderr;
  if (iVar1 == 0) {
    iVar1 = nn_bind(line,"inproc://test");
    pFVar6 = _stderr;
    if (iVar1 < 0) {
      puVar3 = (uint *)__errno_location();
      pcVar4 = nn_err_strerror(*puVar3);
      fprintf(pFVar6,"Failed bind to \"%s\": %s [%d] (%s:%d)\n","inproc://test",pcVar4,
              (ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c"
              ,0x2f);
      nn_err_abort();
    }
    iVar1 = test_socket_impl((char *)0x30,99,family,(int)address);
    test_connect_impl((char *)0x31,iVar1,sock,(char *)address);
    line_00 = test_socket_impl((char *)0x32,99,family_00,(int)address);
    test_connect_impl((char *)0x33,line_00,sock_00,(char *)address);
    line_01 = test_socket_impl((char *)0x34,99,family_01,(int)address);
    test_connect_impl((char *)0x35,line_01,sock_01,(char *)address);
    pcVar4 = (char *)0x0;
    iVar2 = nn_recv(line,buf,7);
    if (iVar2 == -1) {
      iVar2 = nn_errno();
      if (iVar2 == 0x9523dfe) {
        test_send_impl((char *)0x3c,line,0x102117,pcVar4);
        test_recv_impl((char *)0x3f,iVar1,0x102117,pcVar4);
        test_send_impl((char *)0x40,iVar1,0x10211b,pcVar4);
        test_recv_impl((char *)0x43,line_00,0x102117,pcVar4);
        test_send_impl((char *)0x44,line_00,0x10211b,pcVar4);
        test_recv_impl((char *)0x47,line,0x10211b,pcVar4);
        test_recv_impl((char *)0x48,line,0x10211b,pcVar4);
        pcVar4 = (char *)0x0;
        iVar2 = nn_recv(line,buf,7);
        if (iVar2 == -1) {
          iVar2 = nn_errno();
          if (iVar2 == 0x6e) {
            test_recv_impl((char *)0x4f,line_01,0x102117,pcVar4);
            test_send_impl((char *)0x50,line_01,0x10211f,pcVar4);
            test_send_impl((char *)0x53,line,0x102117,pcVar4);
            iVar2 = nn_recv(line,buf,7,0);
            if (iVar2 == -1) {
              iVar2 = nn_errno();
              if (iVar2 == 0x6e) {
                iVar2 = nn_recv(line,buf,7,0);
                if (iVar2 == -1) {
                  iVar2 = nn_errno();
                  if (iVar2 == 0x9523dfe) {
                    test_close_impl((char *)0x5d,line,sock_02);
                    test_close_impl((char *)0x5e,iVar1,sock_03);
                    test_close_impl((char *)0x5f,line_00,sock_04);
                    test_close_impl((char *)0x60,line_01,sock_05);
                    return 0;
                  }
                }
                pFVar6 = _stderr;
                puVar3 = (uint *)__errno_location();
                pcVar4 = nn_err_strerror(*puVar3);
                uVar5 = (ulong)*puVar3;
                uStackY_50 = 0x5b;
                goto LAB_0010160d;
              }
            }
            pFVar6 = _stderr;
            puVar3 = (uint *)__errno_location();
            pcVar4 = nn_err_strerror(*puVar3);
            uVar5 = (ulong)*puVar3;
            uStackY_50 = 0x57;
            goto LAB_0010160d;
          }
        }
        pFVar6 = _stderr;
        puVar3 = (uint *)__errno_location();
        pcVar4 = nn_err_strerror(*puVar3);
        uVar5 = (ulong)*puVar3;
        uStackY_50 = 0x4c;
        goto LAB_0010160d;
      }
    }
    pFVar6 = _stderr;
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    uVar5 = (ulong)*puVar3;
    uStackY_50 = 0x39;
  }
  else {
    puVar3 = (uint *)__errno_location();
    pcVar4 = nn_err_strerror(*puVar3);
    uVar5 = (ulong)*puVar3;
    uStackY_50 = 0x2e;
  }
LAB_0010160d:
  fprintf(pFVar6,"%s [%d] (%s:%d)\n",pcVar4,uVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/survey.c",
          uStackY_50);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int surveyor;
    int respondent1;
    int respondent2;
    int respondent3;
    int deadline;
    char buf [7];

    /*  Test a simple survey with three respondents. */
    surveyor = test_socket (AF_SP, NN_SURVEYOR);
    deadline = 500;
    rc = nn_setsockopt (surveyor, NN_SURVEYOR, NN_SURVEYOR_DEADLINE,
        &deadline, sizeof (deadline));
    errno_assert (rc == 0);
    test_bind (surveyor, SOCKET_ADDRESS);
    respondent1 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent1, SOCKET_ADDRESS);
    respondent2 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent2, SOCKET_ADDRESS);
    respondent3 = test_socket (AF_SP, NN_RESPONDENT);
    test_connect (respondent3, SOCKET_ADDRESS);

    /* Check that attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    /*  Send the survey. */
    test_send (surveyor, "ABC");

    /*  First respondent answers. */
    test_recv (respondent1, "ABC");
    test_send (respondent1, "DEF");

    /*  Second respondent answers. */
    test_recv (respondent2, "ABC");
    test_send (respondent2, "DEF");

    /*  Surveyor gets the responses. */
    test_recv (surveyor, "DEF");
    test_recv (surveyor, "DEF");

    /*  There are no more responses. Surveyor hits the deadline. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /*  Third respondent answers (it have already missed the deadline). */
    test_recv (respondent3, "ABC");
    test_send (respondent3, "GHI");

    /*  Surveyor initiates new survey. */
    test_send (surveyor, "ABC");

    /*  Check that stale response from third respondent is not delivered. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == ETIMEDOUT);

    /* Check that subsequent attempt to recv with no survey pending is EFSM. */
    rc = nn_recv (surveyor, buf, sizeof (buf), 0);
    errno_assert (rc == -1 && nn_errno () == EFSM);

    test_close (surveyor);
    test_close (respondent1);
    test_close (respondent2);
    test_close (respondent3);

    return 0;
}